

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::StoreFindResult(cmFindBase *this,string *value)

{
  string *psVar1;
  char *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  PolicyStatus PVar5;
  int iVar6;
  pointer pcVar7;
  size_type sVar8;
  cmMakefile *pcVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string notFound;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_type local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  PVar5 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  sVar8 = value->_M_string_length;
  if (sVar8 != 0) {
    pcVar9 = (this->super_cmFindCommon).Makefile;
    psVar1 = &this->VariableName;
    if (this->StoreResultInCache == true) {
      cmMakefile::AddCacheDefinition
                (pcVar9,psVar1,(value->_M_dataplus)._M_p,
                 (this->VariableDocumentation)._M_dataplus._M_p,this->VariableType,PVar4 == NEW);
      if (PVar5 != NEW) {
        return;
      }
      bVar3 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1);
      if (!bVar3) {
        return;
      }
      pcVar9 = (this->super_cmFindCommon).Makefile;
      pcVar7 = (value->_M_dataplus)._M_p;
      sVar8 = value->_M_string_length;
    }
    else {
      pcVar7 = (value->_M_dataplus)._M_p;
    }
    value_01._M_str = pcVar7;
    value_01._M_len = sVar8;
    cmMakefile::AddDefinition(pcVar9,psVar1,value_01);
    return;
  }
  psVar1 = &this->VariableName;
  local_90._M_str = (this->VariableName)._M_dataplus._M_p;
  local_90._M_len = (this->VariableName)._M_string_length;
  local_80 = 9;
  local_78 = "-NOTFOUND";
  views._M_len = 2;
  views._M_array = &local_90;
  cmCatViews_abi_cxx11_(&local_f0,views);
  pcVar9 = (this->super_cmFindCommon).Makefile;
  if (this->StoreResultInCache == true) {
    cmMakefile::AddCacheDefinition
              (pcVar9,psVar1,local_f0._M_dataplus._M_p,
               (this->VariableDocumentation)._M_dataplus._M_p,this->VariableType,PVar4 == NEW);
    if ((PVar5 != NEW) ||
       (bVar3 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1),
       !bVar3)) goto LAB_004cd4ab;
    pcVar9 = (this->super_cmFindCommon).Makefile;
  }
  value_00._M_str = local_f0._M_dataplus._M_p;
  value_00._M_len = local_f0._M_string_length;
  cmMakefile::AddDefinition(pcVar9,psVar1,value_00);
LAB_004cd4ab:
  if (this->Required == true) {
    pcVar9 = (this->super_cmFindCommon).Makefile;
    pcVar2 = (this->VariableName)._M_dataplus._M_p;
    sVar8 = (this->VariableName)._M_string_length;
    iVar6 = std::__cxx11::string::compare((char *)&this->FindCommandName);
    if (iVar6 == 0) {
      local_58 = "files";
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&this->FindCommandName);
      local_58 = "names";
      if (iVar6 == 0) {
        local_58 = "files";
      }
    }
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_d0,&this->Names,separator,(string_view)ZEXT816(0));
    local_90._M_len = 0xf;
    local_90._M_str = "Could not find ";
    local_70 = 0x15;
    local_68 = " using the following ";
    local_60 = 5;
    local_50 = 2;
    local_48 = ": ";
    local_40 = local_d0._M_string_length;
    local_38 = local_d0._M_dataplus._M_p;
    views_00._M_len = 6;
    views_00._M_array = &local_90;
    local_80 = sVar8;
    local_78 = pcVar2;
    cmCatViews_abi_cxx11_(&local_b0,views_00);
    cmMakefile::IssueMessage(pcVar9,FATAL_ERROR,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindBase::StoreFindResult(const std::string& value)
{
  bool force =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) == cmPolicies::NEW;
  bool updateNormalVariable =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) == cmPolicies::NEW;

  if (!value.empty()) {
    if (this->StoreResultInCache) {
      this->Makefile->AddCacheDefinition(this->VariableName, value,
                                         this->VariableDocumentation.c_str(),
                                         this->VariableType, force);
      if (updateNormalVariable &&
          this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
        this->Makefile->AddDefinition(this->VariableName, value);
      }
    } else {
      this->Makefile->AddDefinition(this->VariableName, value);
    }

    return;
  }

  auto notFound = cmStrCat(this->VariableName, "-NOTFOUND");
  if (this->StoreResultInCache) {
    this->Makefile->AddCacheDefinition(this->VariableName, notFound,
                                       this->VariableDocumentation.c_str(),
                                       this->VariableType, force);
    if (updateNormalVariable &&
        this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
      this->Makefile->AddDefinition(this->VariableName, notFound);
    }
  } else {
    this->Makefile->AddDefinition(this->VariableName, notFound);
  }

  if (this->Required) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Could not find ", this->VariableName, " using the following ",
               (this->FindCommandName == "find_file" ||
                    this->FindCommandName == "find_path"
                  ? "files"
                  : "names"),
               ": ", cmJoin(this->Names, ", ")));
    cmSystemTools::SetFatalErrorOccurred();
  }
}